

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManage.cpp
# Opt level: O0

void test_print_module(void)

{
  ModuleStruct *local_10;
  ModuleStruct *temp;
  
  local_10 = module_head;
  printf("-------module link-------\n");
  for (; local_10 != (ModuleStruct *)0x0; local_10 = local_10->next) {
    printf("id: %d\n",(ulong)local_10->id);
    printf("cs: %d\n",(ulong)local_10->cs_seg);
    printf("ds: %d\n",(ulong)local_10->ds_seg);
    printf("name: %s\n",local_10->name);
    printf("\n");
  }
  return;
}

Assistant:

void test_print_module() {
	ModuleStruct *temp=module_head;
	printf("-------module link-------\n");
	while (temp)
	{
		printf("id: %d\n",temp->id);
		printf("cs: %d\n", temp->cs_seg);
		printf("ds: %d\n", temp->ds_seg);
		printf("name: %s\n", temp->name);
		printf("\n");
		temp = temp->next;
	}
}